

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [37],char *params_1)

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined4 in_register_00000014;
  long lVar5;
  String argValues [2];
  String *__return_storage_ptr__;
  undefined8 uVar6;
  String local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  __return_storage_ptr__ = &local_68;
  str<char_const(&)[37]>
            (__return_storage_ptr__,(kj *)params,(char (*) [37])CONCAT44(in_register_00000014,line))
  ;
  cVar1 = *params_1;
  heapString(&local_50,1);
  if ((char *)local_50.content.size_ != (char *)0x0) {
    local_50.content.size_ = (size_t)local_50.content.ptr;
  }
  *(char *)local_50.content.size_ = cVar1;
  uVar6 = 2;
  init(this,(EVP_PKEY_CTX *)file);
  lVar5 = 0x18;
  do {
    lVar2 = *(long *)((long)&local_68.content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_68.content.size_ + lVar5);
      *(undefined8 *)((long)&local_68.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_68.content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_68.content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0,__return_storage_ptr__,uVar6);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}